

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_loader.cpp
# Opt level: O0

void __thiscall embree::OBJLoader::flushTriGroup(OBJLoader *this)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong uVar3;
  bool bVar4;
  SubdivMeshNode *pSVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  size_type sVar9;
  reference pvVar10;
  TriangleMeshNode *pTVar11;
  size_t sVar12;
  const_reference pvVar13;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar14;
  uchar *extraout_RDX_01;
  uchar *extraout_RDX_02;
  EVP_PKEY_CTX *pEVar15;
  long in_RDI;
  uchar *in_R8;
  size_t in_R9;
  uint32_t v2;
  uint32_t v1;
  uint32_t v0;
  size_t k;
  Vertex i2;
  Vertex i1;
  Vertex i0;
  vector<embree::Vertex,_std::allocator<embree::Vertex>_> *face_1;
  size_t j_1;
  map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
  vertexMap;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh_1;
  size_t i_12;
  vector<embree::Vertex,_std::allocator<embree::Vertex>_> *face;
  size_t j;
  size_t i_11;
  size_t i_10;
  size_t i_5;
  size_t i;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh;
  Vec3fa v_2;
  Vec3fa v_1;
  Vec3fa v;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fa *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t i_16;
  size_t i_15;
  Vec3fa *old_items_2;
  size_t i_14;
  size_t i_13;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  size_t new_size_alloced_2;
  TriangleMeshNode *in_stack_fffffffffffff568;
  vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
  *in_stack_fffffffffffff570;
  GroupNode *in_stack_fffffffffffff578;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffff580;
  size_type in_stack_fffffffffffff588;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff590;
  size_t in_stack_fffffffffffff5f8;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff600;
  TriangleMeshNode *in_stack_fffffffffffff608;
  BBox1f in_stack_fffffffffffff610;
  Vertex *in_stack_fffffffffffff638;
  Ref<embree::SceneGraph::TriangleMeshNode> *in_stack_fffffffffffff640;
  SubdivMeshNode *in_stack_fffffffffffff648;
  BBox1f in_stack_fffffffffffff650;
  undefined4 local_754;
  undefined4 local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  Triangle local_72c;
  TriangleMeshNode *local_720;
  TriangleMeshNode *local_718;
  TriangleMeshNode *local_710;
  uint32_t local_704;
  uint32_t local_700;
  uint32_t local_6fc;
  ulong local_6f8;
  Vertex local_6f0;
  Vertex local_6e4;
  undefined8 local_6d8;
  uint local_6d0;
  reference local_6c8;
  ulong local_6c0;
  TriangleMeshNode *local_688;
  undefined1 local_679;
  undefined4 local_678;
  undefined4 local_674;
  undefined4 local_670;
  undefined4 uStack_66c;
  long *local_668;
  TriangleMeshNode *local_660;
  ulong local_658;
  undefined4 local_64c;
  reference local_648;
  ulong local_640;
  uint local_638;
  uint local_634;
  uint local_630;
  uint local_62c;
  ulong local_628;
  ulong local_620;
  ulong local_618;
  ulong local_610;
  SubdivMeshNode *local_608;
  undefined1 local_5fd;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 uStack_5f0;
  long *local_5e0;
  SubdivMeshNode *local_5d8 [2];
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 *local_5b8;
  reference local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_598;
  reference local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 *local_570;
  reference local_568;
  long **local_560;
  long **local_550;
  reference local_540;
  reference local_538;
  reference local_530;
  reference local_528;
  long local_520;
  long local_518;
  TriangleMeshNode **local_510;
  TriangleMeshNode **local_508;
  TriangleMeshNode **local_500;
  TriangleMeshNode **local_4f8;
  TriangleMeshNode **local_4f0;
  TriangleMeshNode **local_4e8;
  TriangleMeshNode **local_4e0;
  TriangleMeshNode **local_4d8;
  TriangleMeshNode **local_4d0;
  TriangleMeshNode **local_4c8;
  TriangleMeshNode **local_4c0;
  TriangleMeshNode **local_4b8;
  TriangleMeshNode **local_4b0;
  ulong local_4a8;
  long local_4a0;
  ulong local_498;
  long local_490;
  undefined8 *local_488;
  undefined4 *local_480;
  long *local_478;
  long **local_470;
  long *local_468;
  long **local_460;
  undefined4 *local_458;
  undefined4 *local_450;
  undefined4 *local_448;
  undefined4 *local_440;
  undefined4 *local_438;
  undefined4 *local_430;
  SubdivMeshNode *local_428;
  SubdivMeshNode **local_420;
  SubdivMeshNode **local_418;
  SubdivMeshNode **local_410;
  SubdivMeshNode **local_408;
  SubdivMeshNode **local_400;
  SubdivMeshNode **local_3f8;
  SubdivMeshNode **local_3f0;
  SubdivMeshNode **local_3e8;
  SubdivMeshNode **local_3e0;
  SubdivMeshNode **local_3d8;
  SubdivMeshNode **local_3d0;
  SubdivMeshNode **local_3c8;
  SubdivMeshNode **local_3b0;
  SubdivMeshNode **local_3a8;
  SubdivMeshNode **local_3a0;
  TriangleMeshNode **local_390;
  uint *local_380;
  uint *local_378;
  uint *local_370;
  SubdivMeshNode **local_368;
  TriangleMeshNode *local_358;
  TriangleMeshNode **local_350;
  TriangleMeshNode **local_348;
  TriangleMeshNode **local_340;
  TriangleMeshNode **local_338;
  TriangleMeshNode **local_330;
  TriangleMeshNode **local_328;
  TriangleMeshNode **local_320;
  TriangleMeshNode **local_318;
  TriangleMeshNode **local_310;
  TriangleMeshNode **local_308;
  TriangleMeshNode **local_2f8;
  TriangleMeshNode **local_2e8;
  TriangleMeshNode **local_2d8;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  undefined8 *local_2b8;
  Vec3fa *local_2b0;
  undefined8 *local_2a8;
  undefined8 *local_2a0;
  undefined8 *local_298;
  Vec3fa *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  Vec3fa *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  ulong local_248;
  ulong local_240;
  Vec3fa *local_238;
  ulong local_230;
  ulong local_228;
  size_t local_220;
  ulong local_218;
  reference local_210;
  Vec3fa *local_208;
  Vec3fa *local_200;
  size_t local_1f8;
  reference local_1f0;
  size_t local_1e8;
  Vec3fa *local_1e0;
  reference local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  Vec3fa *local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  size_t local_1a8;
  ulong local_1a0;
  reference local_198;
  Vec3fa *local_190;
  Vec3fa *local_188;
  size_t local_180;
  reference local_178;
  size_t local_170;
  Vec3fa *local_168;
  reference local_160;
  ulong local_158;
  ulong local_150;
  Vec3fa *local_148;
  ulong local_140;
  ulong local_138;
  size_t local_130;
  ulong local_128;
  reference local_120;
  Vec3fa *local_118;
  Vec3fa *local_110;
  size_t local_108;
  reference local_100;
  size_t local_f8;
  Vec3fa *local_f0;
  reference local_e8;
  unsigned_long local_e0 [2];
  ulong local_d0;
  ulong local_c8;
  reference local_c0;
  size_t local_b8;
  unsigned_long local_b0 [2];
  ulong local_a0;
  ulong local_98;
  reference local_90;
  size_t local_88;
  unsigned_long local_80 [2];
  ulong local_70;
  ulong local_68;
  reference local_60;
  size_t local_58;
  Vec3fa *local_50;
  Vec3fa *local_48;
  Vec3fa *local_40;
  Vec3fa *local_38;
  Vec3fa *local_30;
  Vec3fa *local_28;
  TriangleMeshNode *local_20;
  TriangleMeshNode **local_18;
  SubdivMeshNode *local_10;
  SubdivMeshNode **local_8;
  
  bVar4 = std::
          vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
          ::empty((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                   *)in_stack_fffffffffffff580);
  if (!bVar4) {
    if ((*(byte *)(in_RDI + 0x28) & 1) == 0) {
      pTVar11 = (TriangleMeshNode *)::operator_new(0xd8);
      local_679 = 1;
      local_468 = (long *)(in_RDI + 0xf0);
      local_460 = &local_668;
      local_668 = (long *)*local_468;
      if (local_668 != (long *)0x0) {
        (**(code **)(*local_668 + 0x10))();
      }
      local_674 = 0;
      local_678 = 0x3f800000;
      local_430 = &local_670;
      local_438 = &local_674;
      local_440 = &local_678;
      local_670 = 0;
      uStack_66c = 0x3f800000;
      SceneGraph::TriangleMeshNode::TriangleMeshNode
                (in_stack_fffffffffffff608,in_stack_fffffffffffff600,in_stack_fffffffffffff610,
                 in_stack_fffffffffffff5f8);
      local_679 = 0;
      local_350 = &local_660;
      local_358 = pTVar11;
      local_660 = pTVar11;
      if (pTVar11 != (TriangleMeshNode *)0x0) {
        (*(pTVar11->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      local_550 = &local_668;
      if (local_668 != (long *)0x0) {
        (**(code **)(*local_668 + 0x18))();
      }
      local_4b0 = &local_660;
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::resize(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      local_340 = &local_688;
      local_348 = &local_660;
      local_20 = local_660;
      local_18 = &local_688;
      local_688 = local_660;
      if (local_660 != (TriangleMeshNode *)0x0) {
        (*(local_660->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      SceneGraph::GroupNode::add
                (in_stack_fffffffffffff578,
                 (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff570);
      local_390 = &local_688;
      if (local_688 != (TriangleMeshNode *)0x0) {
        (*(local_688->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      std::
      map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
      ::map((map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
             *)0x1bed8a);
      for (local_6c0 = 0; uVar1 = local_6c0,
          sVar12 = std::
                   vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                   ::size((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                           *)(in_RDI + 0xa0)), uVar1 < sVar12; local_6c0 = local_6c0 + 1) {
        local_6c8 = std::
                    vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                    ::operator[]((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                                  *)(in_RDI + 0xa0),local_6c0);
        pvVar13 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::operator[]
                            (local_6c8,0);
        local_6d0 = pvVar13->vn;
        local_6d8._0_4_ = pvVar13->v;
        local_6d8._4_4_ = pvVar13->vt;
        Vertex::Vertex(&local_6e4,0xffffffff);
        pvVar13 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::operator[]
                            (local_6c8,1);
        local_6f0.v = pvVar13->v;
        local_6f0.vt = pvVar13->vt;
        local_6f0.vn = pvVar13->vn;
        for (local_6f8 = 2; uVar1 = local_6f8,
            sVar9 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::size(local_6c8),
            uVar1 < sVar9; local_6f8 = local_6f8 + 1) {
          local_6e4.v = local_6f0.v;
          local_6e4.vt = local_6f0.vt;
          local_6e4.vn = local_6f0.vn;
          pvVar13 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::operator[]
                              (local_6c8,local_6f8);
          local_6f0.v = pvVar13->v;
          local_6f0.vt = pvVar13->vt;
          local_6f0.vn = pvVar13->vn;
          local_330 = &local_710;
          local_338 = &local_660;
          local_710 = local_660;
          if (local_660 != (TriangleMeshNode *)0x0) {
            (*(local_660->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          local_6fc = getVertex((OBJLoader *)in_stack_fffffffffffff650,
                                (map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
                                 *)in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                                in_stack_fffffffffffff638);
          local_308 = &local_710;
          if (local_710 != (TriangleMeshNode *)0x0) {
            (*(local_710->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          local_320 = &local_718;
          local_328 = &local_660;
          local_718 = local_660;
          if (local_660 != (TriangleMeshNode *)0x0) {
            (*(local_660->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          local_700 = getVertex((OBJLoader *)in_stack_fffffffffffff650,
                                (map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
                                 *)in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                                in_stack_fffffffffffff638);
          local_2f8 = &local_718;
          if (local_718 != (TriangleMeshNode *)0x0) {
            (*(local_718->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          local_310 = &local_720;
          local_318 = &local_660;
          local_720 = local_660;
          if (local_660 != (TriangleMeshNode *)0x0) {
            (*(local_660->super_Node).super_RefCount._vptr_RefCount[2])();
          }
          local_704 = getVertex((OBJLoader *)in_stack_fffffffffffff650,
                                (map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
                                 *)in_stack_fffffffffffff648,in_stack_fffffffffffff640,
                                in_stack_fffffffffffff638);
          local_2e8 = &local_720;
          if (local_720 != (TriangleMeshNode *)0x0) {
            (*(local_720->super_Node).super_RefCount._vptr_RefCount[3])();
          }
          local_4b8 = &local_660;
          SceneGraph::TriangleMeshNode::Triangle::Triangle(&local_72c,local_6fc,local_700,local_704)
          ;
          std::
          vector<embree::SceneGraph::TriangleMeshNode::Triangle,_std::allocator<embree::SceneGraph::TriangleMeshNode::Triangle>_>
          ::push_back(in_stack_fffffffffffff570,(value_type *)in_stack_fffffffffffff568);
        }
      }
      local_4c0 = &local_660;
      local_530 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[](&local_660->normals,0);
      if (local_530->size_active != 0) {
        while( true ) {
          local_4c8 = &local_660;
          local_538 = std::
                      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                      ::operator[](&local_660->normals,0);
          uVar1 = local_538->size_active;
          local_4d0 = &local_660;
          sVar12 = SceneGraph::TriangleMeshNode::numVertices(in_stack_fffffffffffff568);
          if (sVar12 <= uVar1) break;
          local_4d8 = &local_660;
          pvVar6 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::operator[](&local_660->normals,0);
          local_488 = &local_748;
          local_258 = 0;
          uStack_250 = 0;
          local_748 = 0;
          uStack_740 = 0;
          local_5b8 = &local_748;
          local_260 = &local_5c8;
          local_5c8 = 0;
          uStack_5c0 = 0;
          uVar1 = pvVar6->size_active;
          local_68 = pvVar6->size_active + 1;
          local_5b0 = pvVar6;
          local_268 = local_5b8;
          local_60 = pvVar6;
          if (pvVar6->size_alloced < local_68) {
            sVar12 = local_68;
            if (pvVar6->size_alloced != 0) {
              local_70 = pvVar6->size_alloced;
              while (local_70 < local_68) {
                local_80[1] = 1;
                local_80[0] = local_70 << 1;
                puVar7 = std::max<unsigned_long>(local_80 + 1,local_80);
                local_70 = *puVar7;
              }
              local_58 = local_70;
              sVar12 = local_58;
            }
          }
          else {
            sVar12 = pvVar6->size_alloced;
          }
          local_58 = sVar12;
          local_130 = local_58;
          uVar3 = uVar1;
          if (uVar1 < pvVar6->size_active) {
            while (local_138 = uVar3, local_138 < pvVar6->size_active) {
              uVar3 = local_138 + 1;
            }
            pvVar6->size_active = uVar1;
          }
          local_128 = uVar1;
          local_120 = pvVar6;
          if (local_58 == pvVar6->size_alloced) {
            for (local_140 = pvVar6->size_active; local_140 < uVar1; local_140 = local_140 + 1) {
              local_50 = pvVar6->items + local_140;
            }
            pvVar6->size_active = uVar1;
          }
          else {
            local_148 = pvVar6->items;
            local_108 = local_58;
            local_100 = pvVar6;
            pVVar8 = (Vec3fa *)
                     alignedMalloc((size_t)in_stack_fffffffffffff578,
                                   (size_t)in_stack_fffffffffffff570);
            pvVar6->items = pVVar8;
            for (local_150 = 0; local_150 < pvVar6->size_active; local_150 = local_150 + 1) {
              local_110 = pvVar6->items + local_150;
              local_118 = local_148 + local_150;
              uVar2 = *(undefined8 *)((long)&local_118->field_0 + 8);
              *(undefined8 *)&local_110->field_0 = *(undefined8 *)&local_118->field_0;
              *(undefined8 *)((long)&local_110->field_0 + 8) = uVar2;
            }
            for (local_158 = pvVar6->size_active; local_158 < local_128; local_158 = local_158 + 1)
            {
              local_48 = pvVar6->items + local_158;
            }
            local_f8 = pvVar6->size_alloced;
            local_f0 = local_148;
            local_e8 = pvVar6;
            alignedFree(in_stack_fffffffffffff568);
            pvVar6->size_active = local_128;
            pvVar6->size_alloced = local_130;
          }
          sVar12 = pvVar6->size_active;
          pvVar6->size_active = sVar12 + 1;
          local_270 = pvVar6->items + sVar12;
          local_278 = &local_5c8;
          *(undefined8 *)&local_270->field_0 = local_5c8;
          *(undefined8 *)((long)&local_270->field_0 + 8) = uStack_5c0;
        }
      }
      local_4e0 = &local_660;
      sVar9 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                        (&local_660->texcoords);
      if (sVar9 != 0) {
        while( true ) {
          local_4e8 = &local_660;
          sVar9 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                            (&local_660->texcoords);
          local_4f0 = &local_660;
          sVar12 = SceneGraph::TriangleMeshNode::numVertices(in_stack_fffffffffffff568);
          if (sVar12 <= sVar9) break;
          local_4f8 = &local_660;
          local_480 = &local_754;
          local_2c0 = &embree::zero;
          local_754 = 0;
          local_2c8 = &embree::zero;
          local_750 = 0;
          std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::push_back
                    ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                     in_stack_fffffffffffff570,(value_type *)in_stack_fffffffffffff568);
        }
      }
      local_500 = &local_660;
      pEVar15 = (EVP_PKEY_CTX *)0x0;
      local_540 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[](&local_660->normals,0);
      puVar14 = extraout_RDX_01;
      if (local_540->size_active == 0) {
        local_508 = &local_660;
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)0x1bfc0c);
        puVar14 = extraout_RDX_02;
      }
      local_510 = &local_660;
      SceneGraph::TriangleMeshNode::verify(local_660,pEVar15,puVar14,sVar12,in_R8,in_R9);
      std::
      map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
      ::~map((map<embree::Vertex,_unsigned_int,_std::less<embree::Vertex>,_std::allocator<std::pair<const_embree::Vertex,_unsigned_int>_>_>
              *)0x1bfc45);
      local_2d8 = &local_660;
      if (local_660 != (TriangleMeshNode *)0x0) {
        (*(local_660->super_Node).super_RefCount._vptr_RefCount[3])();
      }
    }
    else {
      pSVar5 = (SubdivMeshNode *)::operator_new(0x1b0);
      local_5fd = 1;
      local_478 = (long *)(in_RDI + 0xf0);
      local_470 = &local_5e0;
      local_5e0 = (long *)*local_478;
      if (local_5e0 != (long *)0x0) {
        (**(code **)(*local_5e0 + 0x10))();
      }
      local_5f8 = 0;
      local_5fc = 0x3f800000;
      local_448 = &local_5f4;
      local_450 = &local_5f8;
      local_458 = &local_5fc;
      local_5f4 = 0;
      uStack_5f0 = 0x3f800000;
      SceneGraph::SubdivMeshNode::SubdivMeshNode
                (in_stack_fffffffffffff648,
                 (Ref<embree::SceneGraph::MaterialNode> *)in_stack_fffffffffffff640,
                 in_stack_fffffffffffff650,(size_t)in_stack_fffffffffffff638);
      local_5fd = 0;
      local_420 = local_5d8;
      local_428 = pSVar5;
      local_5d8[0] = pSVar5;
      if (pSVar5 != (SubdivMeshNode *)0x0) {
        (*(pSVar5->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      local_560 = &local_5e0;
      if (local_5e0 != (long *)0x0) {
        (**(code **)(*local_5e0 + 0x18))();
      }
      local_3c8 = local_5d8;
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::resize(in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      local_3a8 = &local_608;
      local_3b0 = local_5d8;
      local_10 = local_5d8[0];
      local_8 = &local_608;
      local_608 = local_5d8[0];
      if (local_5d8[0] != (SubdivMeshNode *)0x0) {
        (*(local_5d8[0]->super_Node).super_RefCount._vptr_RefCount[2])();
      }
      SceneGraph::GroupNode::add
                (in_stack_fffffffffffff578,
                 (Ref<embree::SceneGraph::Node> *)in_stack_fffffffffffff570);
      local_3a0 = &local_608;
      if (local_608 != (SubdivMeshNode *)0x0) {
        (*(local_608->super_Node).super_RefCount._vptr_RefCount[3])();
      }
      for (local_610 = 0; local_518 = in_RDI + 0x30, local_610 < *(ulong *)(in_RDI + 0x38);
          local_610 = local_610 + 1) {
        local_3d0 = local_5d8;
        pvVar6 = std::
                 vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ::operator[](&local_5d8[0]->positions,0);
        local_490 = in_RDI + 0x30;
        local_498 = local_610;
        local_570 = (undefined8 *)(*(long *)(in_RDI + 0x48) + local_610 * 0x10);
        local_2a0 = &local_588;
        local_588 = *local_570;
        uStack_580 = local_570[1];
        uVar1 = pvVar6->size_active;
        local_c8 = pvVar6->size_active + 1;
        local_568 = pvVar6;
        local_2a8 = local_570;
        local_c0 = pvVar6;
        if (pvVar6->size_alloced < local_c8) {
          sVar12 = local_c8;
          if (pvVar6->size_alloced != 0) {
            local_d0 = pvVar6->size_alloced;
            while (local_d0 < local_c8) {
              local_e0[1] = 1;
              local_e0[0] = local_d0 << 1;
              puVar7 = std::max<unsigned_long>(local_e0 + 1,local_e0);
              local_d0 = *puVar7;
            }
            local_b8 = local_d0;
            sVar12 = local_b8;
          }
        }
        else {
          sVar12 = pvVar6->size_alloced;
        }
        local_b8 = sVar12;
        local_220 = local_b8;
        uVar3 = uVar1;
        if (uVar1 < pvVar6->size_active) {
          while (local_228 = uVar3, local_228 < pvVar6->size_active) {
            uVar3 = local_228 + 1;
          }
          pvVar6->size_active = uVar1;
        }
        local_218 = uVar1;
        local_210 = pvVar6;
        if (local_b8 == pvVar6->size_alloced) {
          for (local_230 = pvVar6->size_active; local_230 < uVar1; local_230 = local_230 + 1) {
            local_30 = pvVar6->items + local_230;
          }
          pvVar6->size_active = uVar1;
        }
        else {
          local_238 = pvVar6->items;
          local_1f8 = local_b8;
          local_1f0 = pvVar6;
          pVVar8 = (Vec3fa *)
                   alignedMalloc((size_t)in_stack_fffffffffffff578,(size_t)in_stack_fffffffffffff570
                                );
          pvVar6->items = pVVar8;
          for (local_240 = 0; local_240 < pvVar6->size_active; local_240 = local_240 + 1) {
            local_200 = pvVar6->items + local_240;
            local_208 = local_238 + local_240;
            uVar2 = *(undefined8 *)((long)&local_208->field_0 + 8);
            *(undefined8 *)&local_200->field_0 = *(undefined8 *)&local_208->field_0;
            *(undefined8 *)((long)&local_200->field_0 + 8) = uVar2;
          }
          for (local_248 = pvVar6->size_active; local_248 < local_218; local_248 = local_248 + 1) {
            local_28 = pvVar6->items + local_248;
          }
          local_1e8 = pvVar6->size_alloced;
          local_1e0 = local_238;
          local_1d8 = pvVar6;
          alignedFree(in_stack_fffffffffffff568);
          pvVar6->size_active = local_218;
          pvVar6->size_alloced = local_220;
        }
        sVar12 = pvVar6->size_active;
        pvVar6->size_active = sVar12 + 1;
        local_2b0 = pvVar6->items + sVar12;
        local_2b8 = &local_588;
        *(undefined8 *)&local_2b0->field_0 = local_588;
        *(undefined8 *)((long)&local_2b0->field_0 + 8) = uStack_580;
      }
      for (local_618 = 0; local_520 = in_RDI + 0x50, local_618 < *(ulong *)(in_RDI + 0x58);
          local_618 = local_618 + 1) {
        local_3d8 = local_5d8;
        pvVar6 = std::
                 vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 ::operator[](&local_5d8[0]->normals,0);
        local_4a0 = in_RDI + 0x50;
        local_4a8 = local_618;
        local_598 = (undefined8 *)(*(long *)(in_RDI + 0x68) + local_618 * 0x10);
        local_280 = &local_5a8;
        local_5a8 = *local_598;
        uStack_5a0 = local_598[1];
        uVar1 = pvVar6->size_active;
        local_98 = pvVar6->size_active + 1;
        local_590 = pvVar6;
        local_288 = local_598;
        local_90 = pvVar6;
        if (pvVar6->size_alloced < local_98) {
          sVar12 = local_98;
          if (pvVar6->size_alloced != 0) {
            local_a0 = pvVar6->size_alloced;
            while (local_a0 < local_98) {
              local_b0[1] = 1;
              local_b0[0] = local_a0 << 1;
              puVar7 = std::max<unsigned_long>(local_b0 + 1,local_b0);
              local_a0 = *puVar7;
            }
            local_88 = local_a0;
            sVar12 = local_88;
          }
        }
        else {
          sVar12 = pvVar6->size_alloced;
        }
        local_88 = sVar12;
        local_1a8 = local_88;
        uVar3 = uVar1;
        if (uVar1 < pvVar6->size_active) {
          while (local_1b0 = uVar3, local_1b0 < pvVar6->size_active) {
            uVar3 = local_1b0 + 1;
          }
          pvVar6->size_active = uVar1;
        }
        local_1a0 = uVar1;
        local_198 = pvVar6;
        if (local_88 == pvVar6->size_alloced) {
          for (local_1b8 = pvVar6->size_active; local_1b8 < uVar1; local_1b8 = local_1b8 + 1) {
            local_40 = pvVar6->items + local_1b8;
          }
          pvVar6->size_active = uVar1;
        }
        else {
          local_1c0 = pvVar6->items;
          local_180 = local_88;
          local_178 = pvVar6;
          pVVar8 = (Vec3fa *)
                   alignedMalloc((size_t)in_stack_fffffffffffff578,(size_t)in_stack_fffffffffffff570
                                );
          pvVar6->items = pVVar8;
          for (local_1c8 = 0; local_1c8 < pvVar6->size_active; local_1c8 = local_1c8 + 1) {
            local_188 = pvVar6->items + local_1c8;
            local_190 = local_1c0 + local_1c8;
            uVar2 = *(undefined8 *)((long)&local_190->field_0 + 8);
            *(undefined8 *)&local_188->field_0 = *(undefined8 *)&local_190->field_0;
            *(undefined8 *)((long)&local_188->field_0 + 8) = uVar2;
          }
          for (local_1d0 = pvVar6->size_active; local_1d0 < local_1a0; local_1d0 = local_1d0 + 1) {
            local_38 = pvVar6->items + local_1d0;
          }
          local_170 = pvVar6->size_alloced;
          local_168 = local_1c0;
          local_160 = pvVar6;
          alignedFree(in_stack_fffffffffffff568);
          pvVar6->size_active = local_1a0;
          pvVar6->size_alloced = local_1a8;
        }
        sVar12 = pvVar6->size_active;
        pvVar6->size_active = sVar12 + 1;
        local_290 = pvVar6->items + sVar12;
        local_298 = &local_5a8;
        *(undefined8 *)&local_290->field_0 = local_5a8;
        *(undefined8 *)((long)&local_290->field_0 + 8) = uStack_5a0;
      }
      for (local_620 = 0; uVar1 = local_620,
          sVar9 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                             (in_RDI + 0x70)), uVar1 < sVar9; local_620 = local_620 + 1) {
        local_3e0 = local_5d8;
        std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator[]
                  ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                   (in_RDI + 0x70),local_620);
        std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::push_back
                  (in_stack_fffffffffffff580,(value_type *)in_stack_fffffffffffff578);
      }
      for (local_628 = 0; uVar1 = local_628,
          sVar9 = std::vector<embree::Crease,_std::allocator<embree::Crease>_>::size
                            ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)
                             (in_RDI + 0x88)), uVar1 < sVar9; local_628 = local_628 + 1) {
        local_3e8 = local_5d8;
        pvVar10 = std::vector<embree::Crease,_std::allocator<embree::Crease>_>::operator[]
                            ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)
                             (in_RDI + 0x88),local_628);
        local_634 = pvVar10->a;
        pvVar10 = std::vector<embree::Crease,_std::allocator<embree::Crease>_>::operator[]
                            ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)
                             (in_RDI + 0x88),local_628);
        local_370 = &local_630;
        local_378 = &local_634;
        local_380 = &local_638;
        local_630 = local_634;
        local_62c = local_638;
        local_638 = pvVar10->b;
        std::vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_>::push_back
                  ((vector<embree::Vec2<int>,_std::allocator<embree::Vec2<int>_>_> *)
                   in_stack_fffffffffffff570,(value_type *)in_stack_fffffffffffff568);
        local_3f0 = local_5d8;
        std::vector<embree::Crease,_std::allocator<embree::Crease>_>::operator[]
                  ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)(in_RDI + 0x88),
                   local_628);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff580,
                   (value_type_conflict *)in_stack_fffffffffffff578);
      }
      for (local_640 = 0; uVar1 = local_640,
          sVar9 = std::
                  vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                  ::size((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                          *)(in_RDI + 0xa0)), uVar1 < sVar9; local_640 = local_640 + 1) {
        local_648 = std::
                    vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                    ::operator[]((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
                                  *)(in_RDI + 0xa0),local_640);
        local_3f8 = local_5d8;
        sVar9 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::size(local_648);
        local_64c = (undefined4)sVar9;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffff570,
                   (value_type_conflict3 *)in_stack_fffffffffffff568);
        for (local_658 = 0; uVar1 = local_658,
            sVar9 = std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::size(local_648),
            uVar1 < sVar9; local_658 = local_658 + 1) {
          local_400 = local_5d8;
          std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>::operator[]
                    (local_648,local_658);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_fffffffffffff580,(value_type_conflict3 *)in_stack_fffffffffffff578);
        }
      }
      local_408 = local_5d8;
      pEVar15 = (EVP_PKEY_CTX *)0x0;
      local_528 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[](&local_5d8[0]->normals,0);
      puVar14 = extraout_RDX;
      if (local_528->size_active == 0) {
        local_410 = local_5d8;
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::clear((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                 *)0x1be9b2);
        puVar14 = extraout_RDX_00;
      }
      local_418 = local_5d8;
      SceneGraph::SubdivMeshNode::verify(local_5d8[0],pEVar15,puVar14,sVar9,in_R8,in_R9);
      local_368 = local_5d8;
      if (local_5d8[0] != (SubdivMeshNode *)0x0) {
        (*(local_5d8[0]->super_Node).super_RefCount._vptr_RefCount[3])();
      }
    }
    std::
    vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
    ::clear((vector<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>,_std::allocator<std::vector<embree::Vertex,_std::allocator<embree::Vertex>_>_>_>
             *)0x1bfcea);
    std::vector<embree::Crease,_std::allocator<embree::Crease>_>::clear
              ((vector<embree::Crease,_std::allocator<embree::Crease>_> *)0x1bfcfe);
  }
  return;
}

Assistant:

void OBJLoader::flushTriGroup()
  {
    if (curGroup.empty()) return;

    if (subdivMode)
    {
      Ref<SceneGraph::SubdivMeshNode> mesh = new SceneGraph::SubdivMeshNode(curMaterial,BBox1f(0,1),1);
      mesh->normals.resize(1);
      group->add(mesh.cast<SceneGraph::Node>());

      for (size_t i=0; i<v.size();  i++) mesh->positions[0].push_back(v[i]);
      for (size_t i=0; i<vn.size(); i++) mesh->normals[0].push_back(vn[i]);
      for (size_t i=0; i<vt.size(); i++) mesh->texcoords.push_back(vt[i]);
      
      for (size_t i=0; i<ec.size(); ++i) {
        assert(((size_t)ec[i].a < v.size()) && ((size_t)ec[i].b < v.size()));
        mesh->edge_creases.push_back(Vec2i(ec[i].a, ec[i].b));
        mesh->edge_crease_weights.push_back(ec[i].w);
      }
      
      for (size_t j=0; j<curGroup.size(); j++)
      {
        const std::vector<Vertex>& face = curGroup[j];
        mesh->verticesPerFace.push_back(int(face.size()));
        for (size_t i=0; i<face.size(); i++)
          mesh->position_indices.push_back(face[i].v);
      }
      if (mesh->normals[0].size() == 0)
        mesh->normals.clear();
      mesh->verify();
    }
    else
    {
      Ref<SceneGraph::TriangleMeshNode> mesh = new SceneGraph::TriangleMeshNode(curMaterial,BBox1f(0,1),1);
      mesh->normals.resize(1);
      group->add(mesh.cast<SceneGraph::Node>());
      // merge three indices into one
      std::map<Vertex, uint32_t> vertexMap;
      for (size_t j=0; j<curGroup.size(); j++)
      {
        /* iterate over all faces */
        const std::vector<Vertex>& face = curGroup[j];
        
        /* triangulate the face with a triangle fan */
        Vertex i0 = face[0], i1 = Vertex(-1), i2 = face[1];
        for (size_t k=2; k < face.size(); k++) 
        {
          i1 = i2; i2 = face[k];
          uint32_t v0,v1,v2;
          v0 = getVertex(vertexMap, mesh, i0);
          v1 = getVertex(vertexMap, mesh, i1);
          v2 = getVertex(vertexMap, mesh, i2);
          assert(v0 < mesh->numVertices());
          assert(v1 < mesh->numVertices());
          assert(v2 < mesh->numVertices());
          mesh->triangles.push_back(SceneGraph::TriangleMeshNode::Triangle(v0,v1,v2));
        }
      }
      /* there may be vertices without normals or texture coordinates, thus we have to make these arrays the same size here */
      if (mesh->normals[0].size()) while (mesh->normals[0].size() < mesh->numVertices()) mesh->normals[0].push_back(zero);
      if (mesh->texcoords.size()) while (mesh->texcoords.size() < mesh->numVertices()) mesh->texcoords.push_back(zero);

      if (mesh->normals[0].size() == 0)
        mesh->normals.clear();
      mesh->verify();
    }
    
    curGroup.clear();
    ec.clear();
  }